

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Instr * Lowerer::InsertMove(Opnd *dst,Opnd *src,Instr *insertBeforeInstr,bool generateWriteBarrier)

{
  int iVar1;
  Func *func_00;
  code *pcVar2;
  bool bVar3;
  IRType IVar4;
  undefined4 *puVar5;
  Instr *local_40;
  Instr *instr;
  Func *func;
  bool generateWriteBarrier_local;
  Instr *insertBeforeInstr_local;
  Opnd *src_local;
  Opnd *dst_local;
  
  if (dst == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3d27,"(dst)","dst");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (src == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3d28,"(src)","src");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (insertBeforeInstr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3d29,"(insertBeforeInstr)","insertBeforeInstr");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  func_00 = insertBeforeInstr->m_func;
  bVar3 = IR::Opnd::IsFloat(dst);
  if ((bVar3) && (bVar3 = IR::Opnd::IsConstOpnd(src), bVar3)) {
    dst_local = (Opnd *)LoadFloatFromNonReg(src,dst,insertBeforeInstr);
  }
  else {
    IVar4 = IR::Opnd::GetType(dst);
    iVar1 = TySize[IVar4];
    IVar4 = IR::Opnd::GetType(src);
    insertBeforeInstr_local = (Instr *)src;
    if (iVar1 < TySize[IVar4]) {
      IVar4 = IR::Opnd::GetType(dst);
      insertBeforeInstr_local = (Instr *)IR::Opnd::UseWithNewType(src,IVar4,func_00);
    }
    local_40 = IR::Instr::New(Ld_A,dst,(Opnd *)insertBeforeInstr_local,func_00);
    IR::Instr::InsertBefore(insertBeforeInstr,local_40);
    if (generateWriteBarrier) {
      local_40 = LowererMD::ChangeToWriteBarrierAssign(local_40,func_00);
    }
    else {
      LowererMD::ChangeToAssignNoBarrierCheck(local_40);
    }
    dst_local = (Opnd *)local_40;
  }
  return (Instr *)dst_local;
}

Assistant:

IR::Instr *Lowerer::InsertMove(IR::Opnd *dst, IR::Opnd *src, IR::Instr *const insertBeforeInstr, bool generateWriteBarrier)
{
    Assert(dst);
    Assert(src);
    Assert(insertBeforeInstr);

    Func *const func = insertBeforeInstr->m_func;

    if(dst->IsFloat() && src->IsConstOpnd())
    {
        return LoadFloatFromNonReg(src, dst, insertBeforeInstr);
    }

    if(TySize[dst->GetType()] < TySize[src->GetType()])
    {
#if _M_IX86
        if (IRType_IsInt64(src->GetType()))
        {
            // On x86, if we are trying to move an int64 to a smaller type
            // Insert a move of the low bits into dst
            return InsertMove(dst, func->FindOrCreateInt64Pair(src).low, insertBeforeInstr, generateWriteBarrier);
        }
        else
#endif
        {
            src = src->UseWithNewType(dst->GetType(), func);
        }
    }
    IR::Instr * instr = IR::Instr::New(Js::OpCode::Ld_A, dst, src, func);

    insertBeforeInstr->InsertBefore(instr);
    if (generateWriteBarrier)
    {
        instr = LowererMD::ChangeToWriteBarrierAssign(instr, func);
    }
    else
    {
        LowererMD::ChangeToAssignNoBarrierCheck(instr);
    }

    return instr;
}